

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

BranchInstr *
Lowerer::InsertBranch(OpCode opCode,bool isUnsigned,LabelInstr *target,Instr *insertBeforeInstr)

{
  code *pcVar1;
  bool bVar2;
  OpCode OVar3;
  undefined4 *puVar4;
  BranchInstr *instr;
  
  if (target == (LabelInstr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3d5e,"(target)","target");
    if (!bVar2) goto LAB_005b7284;
    *puVar4 = 0;
  }
  if (insertBeforeInstr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3d5f,"(insertBeforeInstr)","insertBeforeInstr");
    if (!bVar2) {
LAB_005b7284:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  instr = IR::BranchInstr::New(opCode,target,insertBeforeInstr->m_func);
  if ((instr->super_Instr).m_opcode < ADD) {
    if (opCode == Br) {
      OVar3 = JMP;
    }
    else if (isUnsigned) {
      OVar3 = LowererMD::MDUnsignedBranchOpcode(opCode);
    }
    else {
      OVar3 = LowererMD::MDBranchOpcode(opCode);
    }
    (instr->super_Instr).m_opcode = OVar3;
  }
  IR::Instr::InsertBefore(insertBeforeInstr,&instr->super_Instr);
  return instr;
}

Assistant:

IR::BranchInstr *Lowerer::InsertBranch(
    const Js::OpCode opCode,
    const bool isUnsigned,
    IR::LabelInstr *const target,
    IR::Instr *const insertBeforeInstr)
{
    Assert(target);
    Assert(insertBeforeInstr);

    Func *const func = insertBeforeInstr->m_func;

    IR::BranchInstr *const instr = IR::BranchInstr::New(opCode, target, func);
    if(!instr->IsLowered())
    {
        if(opCode == Js::OpCode::Br)
        {
            instr->m_opcode = LowererMD::MDUncondBranchOpcode;
        }
        else if(isUnsigned)
        {
            instr->m_opcode = LowererMD::MDUnsignedBranchOpcode(opCode);
        }
        else
        {
            instr->m_opcode = LowererMD::MDBranchOpcode(opCode);
        }
    }

    insertBeforeInstr->InsertBefore(instr);
    return instr;
}